

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_e82c04::isDirentryToIgnore(char *fname)

{
  bool local_13;
  bool local_12;
  bool local_11;
  char *fname_local;
  
  if (fname == (char *)0x0) {
    __assert_fail("fname != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,0x6d,"bool (anonymous namespace)::isDirentryToIgnore(const char *const)");
  }
  if (*fname != '\0') {
    local_11 = false;
    if (*fname == '.') {
      local_12 = true;
      if (fname[1] != '\0') {
        local_13 = false;
        if (fname[1] == '.') {
          local_13 = fname[2] == '\0';
        }
        local_12 = local_13;
      }
      local_11 = local_12;
    }
    return local_11;
  }
  __assert_fail("fname[0] != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFindPackageCommand.cxx"
                ,0x6e,"bool (anonymous namespace)::isDirentryToIgnore(const char *const)");
}

Assistant:

bool isDirentryToIgnore(const char* const fname)
{
  assert(fname != nullptr);
  assert(fname[0] != 0);
  return fname[0] == '.' &&
    (fname[1] == 0 || (fname[1] == '.' && fname[2] == 0));
}